

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O0

void __thiscall
TPZFrontSym<std::complex<long_double>_>::SymbolicAddKel
          (TPZFrontSym<std::complex<long_double>_> *this,TPZVec<long> *destinationindex)

{
  int64_t global;
  int64_t iVar1;
  TPZVec<long> *in_RSI;
  long in_RDI;
  int64_t aux;
  int64_t loop_limit;
  int64_t i;
  undefined4 local_38;
  TPZFrontSym<std::complex<long_double>_> *this_00;
  
  global = TPZVec<long>::NElements(in_RSI);
  for (this_00 = (TPZFrontSym<std::complex<long_double>_> *)0x0; (long)this_00 < global;
      this_00 = (TPZFrontSym<std::complex<long_double>_> *)
                ((long)&(this_00->super_TPZFront<std::complex<long_double>_>).super_TPZSavable.
                        _vptr_TPZSavable + 1)) {
    TPZVec<long>::operator[](in_RSI,(int64_t)this_00);
    Local(this_00,global);
    iVar1 = TPZVec<long>::NElements((TPZVec<long> *)(in_RDI + 0x10));
    *(int64_t *)(in_RDI + 0xa0) = iVar1;
  }
  if (*(long *)(in_RDI + 0xa0) < (long)*(int *)(in_RDI + 0xc)) {
    local_38 = *(undefined4 *)(in_RDI + 0xc);
  }
  else {
    local_38 = (undefined4)*(undefined8 *)(in_RDI + 0xa0);
  }
  *(undefined4 *)(in_RDI + 0xc) = local_38;
  return;
}

Assistant:

void TPZFrontSym<TVar>::SymbolicAddKel(TPZVec < int64_t > & destinationindex)
{
	int64_t i, loop_limit, aux;
	loop_limit=destinationindex.NElements();
	for(i=0;i<loop_limit;i++){
		aux=destinationindex[i];
		Local(aux);
		this->fFront = this->fGlobal.NElements();
	}
	this->fMaxFront=(this->fFront<this->fMaxFront)?this->fMaxFront:this->fFront;
	
}